

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::clara::detail::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  string *optToken;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  Token *pTVar4;
  TokenStream *pTVar5;
  ParserResult *this_00;
  ParserResult result;
  TokenStream remainingTokens;
  ParseState local_d8;
  undefined1 local_a8 [40];
  Result validationResult;
  Token local_50;
  
  (*(this->super_ParserRefImpl<Catch::clara::detail::Opt>).
    super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])
            (&validationResult);
  if (validationResult.super_ResultValueBase<void>.super_ResultBase.m_type != Ok) {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&validationResult);
    goto LAB_00130bf7;
  }
  TokenStream::TokenStream(&remainingTokens,tokens);
  if ((remainingTokens.m_tokenBuffer.
       super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       remainingTokens.m_tokenBuffer.
       super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (remainingTokens.it._M_current == remainingTokens.itEnd._M_current)) {
LAB_00130bc2:
    result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
    _vptr_ResultBase._0_4_ = 1;
    TokenStream::TokenStream
              ((TokenStream *)
               &result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase
                .m_type,&remainingTokens);
    BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
              (__return_storage_ptr__,(ParseState *)&result);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               &result.m_errorMessage._M_string_length);
  }
  else {
    pTVar4 = TokenStream::operator->(&remainingTokens);
    if (pTVar4->type != Option) goto LAB_00130bc2;
    TokenStream::operator*(&local_50,&remainingTokens);
    optToken = &local_50.token;
    bVar2 = isMatch(this,optToken);
    if (!bVar2) {
      ::std::__cxx11::string::~string((string *)optToken);
      goto LAB_00130bc2;
    }
    iVar3 = (*((this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_ref.
               super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_BoundRef[3])();
    peVar1 = (this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_ref.
             super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((char)iVar3 == '\0') {
      TokenStream::operator++(&remainingTokens);
      if ((remainingTokens.m_tokenBuffer.
           super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           remainingTokens.m_tokenBuffer.
           super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (remainingTokens.it._M_current == remainingTokens.itEnd._M_current)) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result,"Expected argument following ",optToken);
        BasicResult<Catch::clara::detail::ParseState>::runtimeError
                  (__return_storage_ptr__,(string *)&result);
        this_00 = &result;
      }
      else {
        TokenStream::operator*((Token *)local_a8,&remainingTokens);
        if (local_a8._0_4_ == Argument) {
          this_00 = (ParserResult *)(local_a8 + 8);
          (*peVar1->_vptr_BoundRef[4])(&result,peVar1,this_00);
          if (result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
              m_type == Ok) {
            (**(code **)(CONCAT44(result.
                                  super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._4_4_,
                                  result.
                                  super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
            if (result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase
                ._12_4_ != 2) {
              BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&result);
              ::std::__cxx11::string::~string((string *)this_00);
              goto LAB_00130d57;
            }
            (**(code **)(CONCAT44(result.
                                  super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._4_4_,
                                  result.
                                  super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
            local_d8.m_type =
                 result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                 super_ResultBase._12_4_;
            TokenStream::TokenStream(&local_d8.m_remainingTokens,&remainingTokens);
            BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                      (__return_storage_ptr__,&local_d8);
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            ~vector(&local_d8.m_remainingTokens.m_tokenBuffer);
          }
          else {
            BasicResult<Catch::clara::detail::ParseState>::
            BasicResult<Catch::clara::detail::ParseResultType>(__return_storage_ptr__,&result);
          }
          BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&result);
        }
        else {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &result,"Expected argument following ",optToken);
          BasicResult<Catch::clara::detail::ParseState>::runtimeError
                    (__return_storage_ptr__,(string *)&result);
          ::std::__cxx11::string::~string((string *)&result);
          this_00 = (ParserResult *)(local_a8 + 8);
        }
      }
      ::std::__cxx11::string::~string((string *)this_00);
    }
    else {
      (*peVar1->_vptr_BoundRef[4])(&result,peVar1,1);
      if (result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
          m_type == Ok) {
        (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                              super_ResultBase._vptr_ResultBase._4_4_,
                              result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                              super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
        if (result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
            _12_4_ != 2) {
          BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&result);
LAB_00130d57:
          pTVar5 = TokenStream::operator++(&remainingTokens);
          result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
          _vptr_ResultBase._0_4_ = 0;
          TokenStream::TokenStream
                    ((TokenStream *)
                     &result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                      super_ResultBase.m_type,pTVar5);
          BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                    (__return_storage_ptr__,(ParseState *)&result);
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                   *)&result.m_errorMessage._M_string_length);
          goto LAB_00130de7;
        }
        (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                              super_ResultBase._vptr_ResultBase._4_4_,
                              result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.
                              super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
        local_d8.m_type =
             result.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
             _12_4_;
        TokenStream::TokenStream(&local_d8.m_remainingTokens,&remainingTokens);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                  (__return_storage_ptr__,&local_d8);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector(&local_d8.m_remainingTokens.m_tokenBuffer);
      }
      else {
        BasicResult<Catch::clara::detail::ParseState>::
        BasicResult<Catch::clara::detail::ParseResultType>(__return_storage_ptr__,&result);
      }
      BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&result);
    }
LAB_00130de7:
    ::std::__cxx11::string::~string((string *)optToken);
  }
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (&remainingTokens.m_tokenBuffer);
LAB_00130bf7:
  BasicResult<void>::~BasicResult(&validationResult);
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const&, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            if( remainingTokens && remainingTokens->type == TokenType::Option ) {
                auto const &token = *remainingTokens;
                if( isMatch(token.token ) ) {
                    if( m_ref->isFlag() ) {
                        auto flagRef = static_cast<detail::BoundFlagRefBase*>( m_ref.get() );
                        auto result = flagRef->setFlag( true );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    } else {
                        auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );
                        ++remainingTokens;
                        if( !remainingTokens )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto const &argToken = *remainingTokens;
                        if( argToken.type != TokenType::Argument )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto result = valueRef->setValue( argToken.token );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    }
                    return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
                }
            }
            return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );
        }